

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O1

MatrixXd *
Util::GetGravJac(MatrixXd *__return_storage_ptr__,Vector3d *pos,Vector3d *vel,double Rearth,
                double wEarth,double mu,double J2,double J3,double drag_coeff)

{
  double dVar1;
  double dVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double *pdVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  ulong uVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  undefined1 auVar42 [16];
  bool bVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long lVar43;
  
  dVar21 = (pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[0];
  dVar24 = (pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[1];
  dVar1 = (pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [2];
  dVar35 = (vel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[0];
  dVar39 = (vel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[1];
  dVar2 = (vel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [2];
  local_20 = 6;
  local_18 = 6;
  local_10 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_20);
  auVar5 = _DAT_001320e0;
  auVar4 = _DAT_001320d0;
  lVar3 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          .m_storage.m_rows;
  pdVar6 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
           ).m_storage.m_data + lVar3 * 3 + 1;
  lVar7 = 0;
  do {
    lVar8 = 0;
    auVar42 = auVar4;
    do {
      bVar44 = SUB164(auVar42 ^ auVar5,4) == -0x80000000 && SUB164(auVar42 ^ auVar5,0) < -0x7ffffffd
      ;
      if (bVar44) {
        dVar10 = 1.0;
        if (lVar7 != lVar8) {
          dVar10 = 0.0;
        }
        pdVar6[lVar8 + -1] = dVar10;
      }
      if (bVar44) {
        dVar10 = 1.0;
        if (lVar7 + -1 != lVar8) {
          dVar10 = 0.0;
        }
        pdVar6[lVar8] = dVar10;
      }
      lVar8 = lVar8 + 2;
      lVar43 = auVar42._8_8_;
      auVar42._0_8_ = auVar42._0_8_ + 2;
      auVar42._8_8_ = lVar43 + 2;
    } while (lVar8 != 4);
    lVar7 = lVar7 + 1;
    pdVar6 = pdVar6 + lVar3;
  } while (lVar7 != 3);
  dVar25 = dVar1 * dVar1;
  dVar9 = dVar21 * dVar21;
  dVar22 = dVar24 * dVar24;
  dVar10 = dVar9 + dVar22 + dVar25;
  dVar11 = pow(dVar10,1.5);
  dVar12 = pow(dVar10,2.5);
  dVar12 = 1.0 / dVar12;
  dVar13 = pow(dVar10,3.5);
  dVar13 = 1.0 / dVar13;
  dVar14 = pow(dVar10,5.5);
  dVar14 = 1.0 / dVar14;
  dVar15 = dVar9 + dVar22 + dVar25 * -4.0;
  dVar16 = pow(1.0 / dVar11,3.0);
  dVar32 = dVar9 * 3.0 + dVar22 * 3.0;
  dVar10 = dVar32 - (dVar25 + dVar25);
  dVar32 = dVar32 + dVar25 * -4.0;
  dVar26 = Rearth * Rearth * J2 * mu;
  dVar27 = J3 * mu;
  dVar36 = dVar27 * dVar16;
  dVar28 = dVar32 * dVar36;
  dVar45 = -(1.0 / dVar11) * mu;
  dVar33 = dVar1 * dVar28 * 2.5 + (dVar45 - dVar26 * dVar15 * dVar13 * 1.5);
  dVar34 = dVar26 * dVar13;
  dVar37 = dVar26 * dVar15 * dVar16;
  dVar47 = (((dVar9 * dVar22 * 6.0 +
             dVar25 * dVar25 * 8.0 + dVar9 * dVar9 * 3.0 + dVar22 * dVar22 * 3.0) -
            dVar25 * dVar9 * 24.0) - dVar25 * dVar22 * 24.0) * dVar27 * dVar14;
  dVar29 = dVar26 * dVar16 * dVar10;
  dVar11 = pow(dVar21,3.0);
  uVar30 = (ulong)DAT_00132b10;
  dVar17 = pow(dVar24,3.0);
  dVar18 = dVar16 * -(dVar27 * dVar25);
  dVar31 = -(dVar27 * dVar25) * dVar14 * dVar32;
  dVar19 = pow(dVar1,3.0);
  pdVar6 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
           ).m_storage.m_data;
  pdVar6[3] = (dVar15 * dVar26 * dVar9 * dVar16 * 10.5 +
              dVar27 * dVar9 * dVar16 * dVar1 * 15.0 +
              ((dVar9 * 3.0 * mu * dVar12 + dVar33) - dVar26 * dVar9 * dVar13 * 3.0)) -
              dVar14 * dVar27 * dVar9 * dVar32 * dVar1 * 22.5;
  dVar20 = dVar1 * dVar34 * dVar21;
  dVar23 = dVar1 * dVar34 * dVar24;
  dVar46 = dVar12 * mu * dVar21;
  dVar38 = dVar1 * dVar46 * 3.0;
  dVar40 = dVar1 * dVar12 * mu * dVar24 * 3.0;
  lVar3 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          .m_storage.m_rows;
  pdVar6[5] = dVar21 * dVar29 * dVar1 * 10.5 +
              ((dVar21 * dVar47 * 4.5 +
               (dVar38 - (dVar11 * 12.0 + dVar21 * dVar22 * 12.0 + dVar21 * dVar25 * -48.0) * dVar36
                         * 0.5)) - dVar20 * 9.0);
  dVar41 = dVar37 * dVar21;
  dVar11 = dVar24 * -(dVar27 * dVar14) * dVar32 * dVar21 * dVar1 * 22.5 +
           dVar41 * dVar24 * 10.5 +
           dVar24 * -(dVar34 * dVar21) * 3.0 +
           dVar46 * dVar24 * 3.0 + dVar21 * dVar36 * dVar24 * dVar1 * 15.0;
  pdVar6[4] = dVar11;
  pdVar6[lVar3 + 3] = dVar11;
  (pdVar6 + lVar3 + 3)[1] =
       dVar32 * dVar14 * (double)((ulong)(dVar27 * dVar22) ^ uVar30) * dVar1 * 22.5 +
       dVar16 * dVar26 * dVar22 * dVar15 * 10.5 +
       dVar1 * dVar27 * dVar22 * dVar16 * 15.0 +
       (double)((ulong)(dVar26 * dVar22) ^ uVar30) * dVar13 * 3.0 +
       dVar22 * 3.0 * mu * dVar12 + dVar33;
  pdVar6[lVar3 + 5] =
       dVar29 * dVar24 * dVar1 * 10.5 +
       ((dVar24 * dVar47 * 4.5 +
        (dVar40 - (dVar17 * 12.0 + dVar9 * dVar24 * 12.0 + dVar24 * dVar25 * -48.0) * dVar36 * 0.5))
       - dVar23 * 9.0);
  dVar11 = dVar1 * dVar37 * dVar24 * 10.5 +
           dVar23 * 12.0 +
           dVar31 * dVar24 * 22.5 + dVar28 * dVar24 * 2.5 + dVar18 * dVar24 * 20.0 + dVar40;
  auVar4._8_4_ = SUB84(dVar11,0);
  auVar4._0_8_ = dVar1 * dVar41 * 10.5 +
                 dVar20 * 12.0 +
                 dVar31 * dVar21 * 22.5 + dVar28 * dVar21 * 2.5 + dVar18 * dVar21 * 20.0 + dVar38;
  auVar4._12_4_ = (int)((ulong)dVar11 >> 0x20);
  *(undefined1 (*) [16])(pdVar6 + lVar3 * 2 + 3) = auVar4;
  pdVar6[lVar3 * 2 + 5] =
       dVar26 * dVar25 * dVar16 * dVar10 * 10.5 +
       dVar47 * dVar1 * 4.5 +
       ((dVar26 * dVar25 * dVar13 * 6.0 +
        (dVar19 * -32.0 + dVar9 * dVar1 * 48.0 + dVar22 * dVar1 * 48.0) * dVar36 * 0.5 +
        dVar25 * mu * dVar12 * 3.0 + dVar45) - dVar10 * dVar34 * 1.5);
  dVar10 = -drag_coeff;
  dVar21 = wEarth * dVar21;
  dVar24 = wEarth * dVar24;
  dVar1 = dVar35 + dVar24;
  dVar13 = dVar39 - dVar21;
  dVar12 = dVar1 * dVar1 + dVar13 * dVar13 + dVar2 * dVar2;
  dVar9 = SQRT(dVar12);
  dVar11 = dVar9;
  if (dVar12 < 0.0) {
    dVar11 = sqrt(dVar12);
  }
  dVar11 = 1.0 / dVar11;
  if (dVar12 < 0.0) {
    dVar9 = sqrt(dVar12);
  }
  dVar24 = dVar24 + dVar24 + dVar35 + dVar35;
  dVar12 = (dVar39 + dVar39) - (dVar21 + dVar21);
  pdVar6 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
           ).m_storage.m_data;
  lVar3 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          .m_storage.m_rows;
  dVar21 = dVar10 * dVar9;
  dVar35 = dVar11 * dVar10 * dVar1;
  dVar14 = dVar1 * drag_coeff * dVar13 * dVar11 * wEarth;
  pdVar6[3] = dVar14 + pdVar6[3];
  pdVar6[4] = dVar9 * drag_coeff * wEarth + dVar13 * dVar13 * drag_coeff * dVar11 * wEarth +
              pdVar6[4];
  dVar39 = dVar11 * drag_coeff * dVar13;
  pdVar6[5] = dVar2 * dVar39 * wEarth + pdVar6[5];
  pdVar6[lVar3 + 3] =
       (dVar21 * wEarth - dVar1 * dVar1 * drag_coeff * dVar11 * wEarth) + pdVar6[lVar3 + 3];
  pdVar6[lVar3 + 4] = pdVar6[lVar3 + 4] - dVar14;
  dVar9 = dVar1 * drag_coeff * dVar11;
  pdVar6[lVar3 + 5] = dVar2 * dVar35 * wEarth + pdVar6[lVar3 + 5];
  pdVar6[lVar3 * 3 + 3] = dVar24 * dVar9 * -0.5 + dVar21 + pdVar6[lVar3 * 3 + 3];
  dVar1 = (pdVar6 + lVar3 * 3 + 4)[1];
  pdVar6[lVar3 * 3 + 4] = dVar24 * dVar39 * -0.5 + pdVar6[lVar3 * 3 + 4];
  (pdVar6 + lVar3 * 3 + 4)[1] = dVar2 * dVar24 * drag_coeff * dVar11 * -0.5 + dVar1;
  pdVar6[lVar3 * 4 + 3] = dVar9 * dVar12 * -0.5 + pdVar6[lVar3 * 4 + 3];
  pdVar6[lVar3 * 4 + 4] = dVar39 * dVar12 * -0.5 + dVar21 + pdVar6[lVar3 * 4 + 4];
  pdVar6[lVar3 * 4 + 5] = drag_coeff * dVar11 * dVar12 * dVar2 * -0.5 + pdVar6[lVar3 * 4 + 5];
  dVar1 = (pdVar6 + lVar3 * 5 + 3)[1];
  pdVar6[lVar3 * 5 + 3] = dVar2 * dVar35 + pdVar6[lVar3 * 5 + 3];
  (pdVar6 + lVar3 * 5 + 3)[1] = dVar2 * dVar11 * dVar10 * dVar13 + dVar1;
  pdVar6[lVar3 * 5 + 5] = (dVar21 - dVar2 * dVar2 * drag_coeff * dVar11) + pdVar6[lVar3 * 5 + 5];
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd GetGravJac(Eigen::Vector3d pos, Eigen::Vector3d vel, double Rearth, double wEarth, double mu, double J2, double J3, double drag_coeff){

		//extract locals
		double x = pos[0];
		double y = pos[1];
		double z = pos[2];
		double v_x = vel[0];
		double v_y = vel[1];
		double v_z = vel[2];

		//initialize matrix
		Eigen::MatrixXd jac = Eigen::MatrixXd::Zero(6,6);

		//velocity component
		jac.block(0,3,3,3) = Eigen::Matrix3d::Identity(3,3);

		//vector A which will be reshaped
		double A_vec[9];

		////// Begin auto-generated code from matlab /////////////

		double t3;
		double t5;
		double t7;
		double t9;
		double t11;
		double t14;
		double t47;
		double t23;
		double t25;
		double t26;
		double t27;
		double t29;
		double t24;
		double t28;
		double t30;
		double t31;
		double t32;
		double t35;
		double t36;
		double t40_tmp;
		double t42_tmp_tmp;
		double t42_tmp;
		double b_t42_tmp;
		double t47_tmp_tmp;
		double b_t47_tmp_tmp;
		double t47_tmp;
		double A_vec_tmp;
		double b_A_vec_tmp;
		double c_A_vec_tmp;

		/* CREATEA */
		/*     A_VEC = CREATEA(J2,J3,REARTH,MU,X,Y,Z) */
		/*     This function was generated by the Symbolic Math Toolbox version 8.4. */
		/*     03-Apr-2021 15:18:59 */
		t3 = x * x;
		t5 = y * y;
		t7 = z * z;
		t9 = t3 * 3.0;
		t11 = t5 * 3.0;
		t14 = t7 * 4.0;
		t47 = t3 + t5;
		t23 = t47 + t7;
		t25 = 1.0 / pow(t23, 1.5);
		t26 = 1.0 / pow(t23, 2.5);
		t27 = 1.0 / pow(t23, 3.5);
		t29 = 1.0 / pow(t23, 5.5);
		t24 = t47 + -t14;
		t28 = pow(t25, 3.0);
		t23 = t9 + t11;
		t30 = t23 + -(t7 * 2.0);
		t31 = t23 + -t14;
		t32 = mu * t25;
		t23 = mu * t26;
		t47 = t23 * x;
		t35 = t47 * z * 3.0;
		t36 = t23 * y * z * 3.0;
		t40_tmp = J2 * mu * (Rearth * Rearth);
		t23 = t40_tmp * t24;
		t42_tmp_tmp = J3 * mu;
		t42_tmp = t42_tmp_tmp * t28;
		b_t42_tmp = t42_tmp * t31;
		t14 = t42_tmp_tmp * t29;
		t47_tmp_tmp = t40_tmp * t27;
		t25 = t47_tmp_tmp * x;
		b_t47_tmp_tmp = t23 * t28;
		t47_tmp = b_t47_tmp_tmp * x;
		t47 = (((t47 * y * 3.0 + t42_tmp * x * y * z * 15.0) + -(t25 * y * 3.0)) +
		 t47_tmp * y * 10.5) + -(t14 * t31 * x * y * z * 22.5);
		A_vec_tmp = t40_tmp * t3;
		b_A_vec_tmp = t42_tmp_tmp * t3;
		c_A_vec_tmp = (-t32 + -(t23 * t27 * 1.5)) + b_t42_tmp * z * 2.5;
		A_vec[0] = ((((c_A_vec_tmp + mu * t9 * t26) - A_vec_tmp * t27 * 3.0) +
		       b_A_vec_tmp * t28 * z * 15.0) + A_vec_tmp * t24 * t28 * 10.5) -
		b_A_vec_tmp * t29 * t31 * z * 22.5;
		A_vec[1] = t47;
		A_vec_tmp = t14 * (((((t3 * t3 * 3.0 + t5 * t5 * 3.0) + t7 * t7 * 8.0) + t3 *
		               t5 * 6.0) + -(t3 * t7 * 24.0)) + -(t5 * t7 * 24.0));
		b_A_vec_tmp = t40_tmp * t28 * t30;
		t14 = t25 * z;
		A_vec[2] = (((t35 - t42_tmp * ((t5 * x * 12.0 - t7 * x * 48.0) + pow(x,
		3.0) * 12.0) / 2.0) + A_vec_tmp * x * 4.5) - t14 * 9.0) + b_A_vec_tmp * x *
		z * 10.5;
		A_vec[3] = t47;
		t23 = t40_tmp * t5;
		t47 = t42_tmp_tmp * t5;
		A_vec[4] = ((((c_A_vec_tmp + mu * t11 * t26) - t23 * t27 * 3.0) + t47 * t28 *
		       z * 15.0) + t23 * t24 * t28 * 10.5) - t47 * t29 * t31 * z * 22.5;
		c_A_vec_tmp = t47_tmp_tmp * y * z;
		A_vec[5] = (((t36 - t42_tmp * ((t3 * y * 12.0 - t7 * y * 48.0) + pow(y,
		3.0) * 12.0) / 2.0) + A_vec_tmp * y * 4.5) - c_A_vec_tmp * 9.0) +
		b_A_vec_tmp * y * z * 10.5;
		b_A_vec_tmp = t42_tmp_tmp * t7;
		t23 = b_A_vec_tmp * t28;
		b_A_vec_tmp = b_A_vec_tmp * t29 * t31;
		A_vec[6] = ((((t35 - t23 * x * 20.0) + b_t42_tmp * x * 2.5) - b_A_vec_tmp * x *
		       22.5) + t14 * 12.0) + t47_tmp * z * 10.5;
		A_vec[7] = ((((t36 - t23 * y * 20.0) + b_t42_tmp * y * 2.5) - b_A_vec_tmp * y *
		       22.5) + c_A_vec_tmp * 12.0) + b_t47_tmp_tmp * y * z * 10.5;
		b_A_vec_tmp = t40_tmp * t7;
		A_vec[8] = (((((-t32 + mu * t7 * t26 * 3.0) + t42_tmp * ((t3 * z * 48.0 + t5 *
		z * 48.0) - pow(z, 3.0) * 32.0) / 2.0) + b_A_vec_tmp * t27 * 6.0) -
		       t47_tmp_tmp * t30 * 1.5) + A_vec_tmp * z * 4.5) + b_A_vec_tmp *
		t28 * t30 * 10.5;


		///////////////// end matlab code /////////////////////

		//reshape A
		jac(3,0) = A_vec[0];
		jac(4,0) = A_vec[1];
		jac(5,0) = A_vec[2];
		jac(3,1) = A_vec[3];
		jac(4,1) = A_vec[4];
		jac(5,1) = A_vec[5];
		jac(3,2) = A_vec[6];
		jac(4,2) = A_vec[7];
		jac(5,2) = A_vec[8];



		/////////// begin matlab drag code /////////

		t5 = wEarth*x;
		double t2 = -t5+v_y;
		t3 = wEarth*y;
		double t4 = t3+v_x;
		double t6 = pow(t2,2.0);
		t7 = pow(t4,2.0);
		double t8 = pow(v_z,2.0);
		t9 = t6+t7+t8;
		double t10 = 1.0/sqrt(t9);
		t11 = sqrt(t9);
		double t12 = drag_coeff*t2*t4*t10*wEarth;
		double t13 = v_x*2.0;
		t14 = wEarth*y*2.0;
		double t15 = t13+t14;
		double t16 = v_y*2.0;
		double t18 = wEarth*x*2.0;
		double t17 = t16-t18;
		jac(3,0) += t12;
		jac(4,0) += drag_coeff*t11*wEarth+drag_coeff*t6*t10*wEarth;
		jac(5,0) += drag_coeff*t2*t10*v_z*wEarth;
		jac(3,1) += -drag_coeff*t11*wEarth-drag_coeff*t7*t10*wEarth;
		jac(4,1) += -t12;
		jac(5,1) += -drag_coeff*t4*t10*v_z*wEarth;
		jac(3,3) += -drag_coeff*t11-drag_coeff*t4*t10*t15*(1.0/2.0);
		jac(4,3) += drag_coeff*t2*t10*t15*(-1.0/2.0);
		jac(5,3) += drag_coeff*t10*t15*v_z*(-1.0/2.0);
		jac(3,4) += drag_coeff*t4*t10*t17*(-1.0/2.0);
		jac(4,4) += -drag_coeff*t11-drag_coeff*t2*t10*t17*(1.0/2.0);
		jac(5,4) += drag_coeff*t10*t17*v_z*(-1.0/2.0);
		jac(3,5) += -drag_coeff*t4*t10*v_z;
		jac(4,5) += -drag_coeff*t2*t10*v_z;
		jac(5,5) += -drag_coeff*t11-drag_coeff*t8*t10;


		////////////////////// end matlab drag code ////////////////


		//return
		return jac;

	}